

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STInteger.cpp
# Opt level: O0

Value __thiscall
jbcoin::STInteger<unsigned_short>::getJson(STInteger<unsigned_short> *this,int param_1)

{
  bool bVar1;
  SField *pSVar2;
  KnownFormats<jbcoin::LedgerEntryType> *this_00;
  Item *this_01;
  KnownFormats<jbcoin::TxType> *this_02;
  Item *this_03;
  string *psVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  undefined4 in_register_00000034;
  STBase *this_04;
  Value VVar5;
  Item *item_1;
  Item *item;
  int param_1_local;
  STInteger<unsigned_short> *this_local;
  
  this_04 = (STBase *)CONCAT44(in_register_00000034,param_1);
  pSVar2 = STBase::getFName(this_04);
  bVar1 = SField::operator==(pSVar2,(SField *)sfLedgerEntryType);
  if (bVar1) {
    this_00 = &LedgerFormats::getInstance()->super_KnownFormats<jbcoin::LedgerEntryType>;
    this_01 = KnownFormats<jbcoin::LedgerEntryType>::findByType
                        (this_00,(uint)*(ushort *)&this_04[1]._vptr_STBase);
    if (this_01 != (Item *)0x0) {
      psVar3 = KnownFormats<jbcoin::LedgerEntryType>::Item::getName_abi_cxx11_(this_01);
      Json::Value::Value((Value *)this,psVar3);
      uVar4 = extraout_RDX;
      goto LAB_002fb261;
    }
  }
  pSVar2 = STBase::getFName(this_04);
  bVar1 = SField::operator==(pSVar2,(SField *)sfTransactionType);
  if (bVar1) {
    this_02 = &TxFormats::getInstance()->super_KnownFormats<jbcoin::TxType>;
    this_03 = KnownFormats<jbcoin::TxType>::findByType
                        (this_02,(uint)*(ushort *)&this_04[1]._vptr_STBase);
    if (this_03 != (Item *)0x0) {
      psVar3 = KnownFormats<jbcoin::TxType>::Item::getName_abi_cxx11_(this_03);
      Json::Value::Value((Value *)this,psVar3);
      uVar4 = extraout_RDX_00;
      goto LAB_002fb261;
    }
  }
  Json::Value::Value((Value *)this,(uint)*(ushort *)&this_04[1]._vptr_STBase);
  uVar4 = extraout_RDX_01;
LAB_002fb261:
  VVar5._8_8_ = uVar4;
  VVar5.value_.map_ = (ObjectValues *)this;
  return VVar5;
}

Assistant:

Json::Value
STUInt16::getJson (int) const
{
    if (getFName () == sfLedgerEntryType)
    {
        auto item = LedgerFormats::getInstance ().findByType (
            static_cast <LedgerEntryType> (value_));

        if (item != nullptr)
            return item->getName ();
    }

    if (getFName () == sfTransactionType)
    {
        auto item = TxFormats::getInstance().findByType (
            static_cast <TxType> (value_));

        if (item != nullptr)
            return item->getName ();
    }

    return value_;
}